

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

void __thiscall
passthrough_resampler<short>::drop_audio_if_needed(passthrough_resampler<short> *this)

{
  size_t *psVar1;
  ulong uVar2;
  short *__dest;
  cubeb_log_level cVar3;
  cubeb_log_callback p_Var4;
  uint uVar5;
  uint uVar6;
  ulong uVar8;
  uint uVar7;
  
  uVar5 = this->sample_rate / 0x14;
  uVar7 = (uint)((this->internal_input_buffer).length_ / (ulong)(this->super_processor).channels);
  uVar6 = uVar7 - uVar5;
  if (uVar5 <= uVar7 && uVar6 != 0) {
    cVar3 = cubeb_log_get_level();
    if (1 < (int)cVar3) {
      p_Var4 = cubeb_log_get_callback();
      if (p_Var4 != (cubeb_log_callback)0x0) {
        cubeb_async_log("Dropping %u frames",(ulong)uVar6);
      }
    }
    uVar8 = (ulong)(this->super_processor).channels * (ulong)uVar6;
    uVar2 = (this->internal_input_buffer).length_;
    if ((uVar8 <= uVar2) && (__dest = (this->internal_input_buffer).data_, __dest != (short *)0x0))
    {
      memmove(__dest,__dest + uVar8,(uVar2 - uVar8) * 2);
      psVar1 = &(this->internal_input_buffer).length_;
      *psVar1 = *psVar1 - uVar8;
    }
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      ALOGV("Dropping %u frames", available - to_keep);
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }